

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  byte *pbVar1;
  long lVar2;
  undefined8 *puVar3;
  int extraout_EAX;
  Symbol *pSVar4;
  long lVar5;
  
  symbol_init();
  for (lVar5 = 8; lVar5 != 0x5b8; lVar5 = lVar5 + 0x10) {
    pSVar4 = install(*(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar5),
                     (int)*(short *)((long)&keywords[0].name + lVar5));
    pSVar4->subtype = 1;
  }
  for (lVar5 = 0x10; lVar5 != 0x1d8; lVar5 = lVar5 + 0x18) {
    lVar2 = *(long *)((long)&keywords[0x5b].kval + lVar5);
    pSVar4 = install(*(char **)((long)&keywords[0x5b].name + lVar5),0x129);
    pSVar4->subtype = lVar2;
    *(int *)&pSVar4->u = (int)*(short *)((long)&methods[0].name + lVar5);
  }
  for (lVar5 = 0x10; lVar5 != 0x58; lVar5 = lVar5 + 0x18) {
    puVar3 = *(undefined8 **)((long)&special[0].name + lVar5);
    pSVar4 = install(*(char **)((long)&methods[0x13].subtype + lVar5),1);
    *puVar3 = pSVar4;
    pSVar4->subtype = (long)*(short *)((long)&methods[0x13].varstep + lVar5);
  }
  for (lVar5 = 0; lVar5 != 0x220; lVar5 = lVar5 + 8) {
    pSVar4 = install(*(char **)((long)extdef + lVar5),0x13e);
    pSVar4->subtype = 0x8000;
  }
  for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 8) {
    pSVar4 = install(*(char **)((long)extdef2 + lVar5),0x13e);
    pSVar4->subtype = 0x40000;
  }
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 0x58) {
      lVar5 = 0;
      while( true ) {
        if (lVar5 == 8) {
          lVar5 = 0;
          while( true ) {
            if (lVar5 == 0x98) {
              intoken = newlist();
              initfunc = newlist();
              modelfunc = newlist();
              termfunc = newlist();
              procfunc = newlist();
              initlist = newlist();
              firstlist = newlist();
              syminorder = newlist();
              plotlist = newlist();
              constructorfunc = newlist();
              destructorfunc = newlist();
              units_def_for_acc = newlist();
              nrninit();
              return extraout_EAX;
            }
            pSVar4 = lookup(*(char **)((long)extdef5 + lVar5));
            if (pSVar4 == (Symbol *)0x0) break;
            pbVar1 = (byte *)((long)&pSVar4->subtype + 2);
            *pbVar1 = *pbVar1 | 0x80;
            lVar5 = lVar5 + 8;
          }
          __assert_fail("s",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/init.c"
                        ,0x107,"void init()");
        }
        pSVar4 = lookup(*(char **)((long)extdef4 + lVar5));
        if ((pSVar4 == (Symbol *)0x0) || (-1 < (short)pSVar4->subtype)) break;
        pSVar4->subtype = pSVar4->subtype | 0x400000;
        lVar5 = lVar5 + 8;
      }
      __assert_fail("s && (s->subtype & EXTDEF)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/init.c"
                    ,0x102,"void init()");
    }
    pSVar4 = lookup(*(char **)((long)extdef3 + lVar5));
    if ((pSVar4 == (Symbol *)0x0) || (-1 < (short)pSVar4->subtype)) break;
    pSVar4->subtype = pSVar4->subtype | 0x100000;
    lVar5 = lVar5 + 8;
  }
  __assert_fail("s && (s->subtype & EXTDEF)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/init.c"
                ,0xfd,"void init()");
}

Assistant:

void init()
{
	int             i;
	Symbol         *s;

	symbol_init();
	for (i = 0; keywords[i].name; i++) {
		s = install(keywords[i].name, keywords[i].kval);
		s->subtype = KEYWORD;
	}
	for (i = 0; methods[i].name; i++) {
		s = install(methods[i].name, METHOD);
		s->subtype = methods[i].subtype;
		s->u.i = methods[i].varstep;
	}
	for (i = 0; special[i].name; i++) {
		s = install(special[i].name, SPECIAL);
		*(special[i].p) = s;
		s->subtype = special[i].subtype;
	}
	for (i = 0; extdef[i]; i++) {
		s = install(extdef[i], NAME);
		s->subtype = EXTDEF;
	}
	for (i = 0; extdef2[i]; i++) {
		s = install(extdef2[i], NAME);
		s->subtype = EXTDEF2;
	}
	for (i = 0; extdef3[i]; i++) {
		s = lookup(extdef3[i]);
		assert(s && (s->subtype & EXTDEF));
		s->subtype |= EXTDEF3;
	}
	for (i = 0; extdef4[i]; i++) {
		s = lookup(extdef4[i]);
		assert(s && (s->subtype & EXTDEF));
		s->subtype |= EXTDEF4;
	}
	for (i = 0; extdef5[i]; i++) {
		s = lookup(extdef5[i]);
		assert(s);
		s->subtype |= EXTDEF5;
	}
	intoken = newlist();
	initfunc = newlist();
	modelfunc = newlist();
	termfunc = newlist();
	procfunc = newlist();
	initlist = newlist();
	firstlist = newlist();
	syminorder = newlist();
	plotlist = newlist();
	constructorfunc = newlist();
	destructorfunc = newlist();
	units_def_for_acc = newlist();
#if NMODL
	nrninit();
#endif
}